

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  int iVar6;
  errr eVar7;
  char *pcVar8;
  game_mode_type local_4c;
  char *local_38;
  char *arg;
  char *pcStack_28;
  _Bool args;
  char *mstr;
  _Bool done;
  _Bool select_game;
  _Bool new_game;
  char **ppcStack_18;
  int i;
  char **argv_local;
  int argc_local;
  
  bVar4 = 0;
  bVar3 = false;
  bVar2 = false;
  pcStack_28 = (char *)0x0;
  bVar1 = true;
  argv0 = *argv;
  umask(0x12);
  player_uid = getuid();
  safe_setuid_drop();
  init_stuff();
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  for (mstr._4_4_ = 1; bVar1 && mstr._4_4_ < (int)argv_local; mstr._4_4_ = mstr._4_4_ + 1) {
    pcVar8 = ppcStack_18[mstr._4_4_];
    local_38 = pcVar8 + 1;
    pcVar5 = pcStack_28;
    if (*pcVar8 != '-') goto LAB_0012e3b0;
    local_38 = pcVar8 + 2;
    switch(pcVar8[1]) {
    case '-':
      ppcStack_18[mstr._4_4_] = *ppcStack_18;
      argv_local._0_4_ = (int)argv_local - mstr._4_4_;
      ppcStack_18 = ppcStack_18 + mstr._4_4_;
      bVar1 = false;
      break;
    default:
      goto LAB_0012e3b0;
    case 'c':
      bVar3 = true;
      break;
    case 'd':
      change_path(local_38);
      goto LAB_0012e4e6;
    case 'f':
      arg_force_name = true;
      break;
    case 'g':
      arg_graphics = L'\x02';
      if (*local_38 != '\0') {
        arg_graphics = atoi(local_38);
      }
      break;
    case 'l':
      list_saves();
      exit(0);
    case 'm':
      pcVar5 = local_38;
      if (*local_38 == '\0') goto LAB_0012e3b0;
      goto LAB_0012e4e6;
    case 'n':
      bVar4 = 1;
      break;
    case 'u':
      if (*local_38 == '\0') goto LAB_0012e3b0;
      my_strcpy(arg_name,local_38,0x20);
      savefile_set_name(local_38,false,false);
      goto LAB_0012e4e6;
    case 'w':
      arg_wizard = true;
    }
    while (pcVar5 = pcStack_28, *local_38 != '\0') {
LAB_0012e3b0:
      puts("Usage: angband [options] [-- subopts]");
      puts("  -c             Select savefile with a menu; overrides -n");
      puts(
          "  -n             Start a new character (WARNING: overwrites default savefile without -u)"
          );
      puts("  -l             Lists all savefiles you can play");
      puts("  -w             Resurrect dead character (marks savefile)");
      puts("  -g             Request graphics mode");
      puts("  -u<who>        Use your <who> savefile");
      puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
      for (mstr._4_4_ = 0; mstr._4_4_ < 0xd; mstr._4_4_ = mstr._4_4_ + 1) {
        printf("    %s (default is %s)\n",change_path_values[mstr._4_4_].name,
               *change_path_values[mstr._4_4_].path);
      }
      puts("                 Multiple -d options are allowed.");
      puts("  -m<sys>        Use module <sys>, where <sys> can be:");
      for (mstr._4_4_ = 0; mstr._4_4_ < 2; mstr._4_4_ = mstr._4_4_ + 1) {
        printf("     %s   %s\n",modules[mstr._4_4_].name,modules[mstr._4_4_].help);
      }
      quit((char *)0x0);
    }
LAB_0012e4e6:
    pcStack_28 = pcVar5;
  }
  if (bVar1) {
    argv_local._0_4_ = 1;
    ppcStack_18[1] = (char *)0x0;
  }
  quit_aux = quit_hook;
  if (pcStack_28 != (char *)0x0) {
    ANGBAND_SYS = pcStack_28;
  }
  pcVar8 = setlocale(0,"");
  if (pcVar8 != (char *)0x0) {
    pcVar8 = nl_langinfo(0xe);
    iVar6 = strcmp(pcVar8,"UTF-8");
    if (iVar6 != 0) {
      quit("Angband requires UTF-8 support");
    }
  }
  if (arg_name[0] == '\0') {
    user_name(arg_name,0x20,player_uid);
    savefile_set_name(arg_name,true,false);
  }
  create_needed_dirs();
  mstr._4_4_ = 0;
  do {
    if (1 < mstr._4_4_) {
LAB_0012e64a:
      if (!bVar2) {
        quit("Unable to prepare any \'display module\'!");
      }
      signals_init();
      cmd_get_hook = textui_get_cmd;
      reinit_hook = generic_reinit;
      generic_reinit();
      init_display();
      init_angband();
      textui_init();
      pause_line((term_conflict1 *)Term);
      if (bVar3) {
        local_4c = GAME_SELECT;
      }
      else {
        local_4c = (game_mode_type)bVar4;
      }
      play_game(local_4c);
      textui_cleanup();
      cleanup_angband();
      quit((char *)0x0);
      return 0;
    }
    if ((pcStack_28 == (char *)0x0) ||
       (iVar6 = strcmp(pcStack_28,modules[mstr._4_4_].name), iVar6 == 0)) {
      ANGBAND_SYS = modules[mstr._4_4_].name;
      eVar7 = (*modules[mstr._4_4_].init)((int)argv_local,ppcStack_18);
      if (eVar7 == 0) {
        bVar2 = true;
        goto LAB_0012e64a;
      }
    }
    mstr._4_4_ = mstr._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	bool new_game = false, select_game = false;
	bool done = false;

	const char *mstr = NULL;
	bool args = true;

	/* Save the "program name" XXX XXX XXX */
	argv0 = argv[0];

#ifdef UNIX

	/* Default permissions on files */
	(void)umask(022);

	/* Get the user id */
	player_uid = getuid();

#endif /* UNIX */

#ifdef SETGID

	/* Save the effective GID for later recall */
	player_egid = getegid();

#endif /* UNIX */


	/* Drop permissions */
	safe_setuid_drop();

	/* Get the file paths 
	 * Paths may be overriden by -d options, so this has to occur *before* 
	 * processing command line args */
	init_stuff();

	/* Process the command line arguments */
	for (i = 1; args && (i < argc); i++) {
		const char *arg = argv[i];

		/* Require proper options */
		if (*arg++ != '-') goto usage;

		/* Analyze option */
		switch (*arg++)
		{
			case 'c':
				select_game = true;
				break;

			case 'l':
				list_saves();
				exit(0);

			case 'n':
				new_game = true;
				break;

			case 'w':
				arg_wizard = true;
				break;

			case 'g':
				/* Default graphics tile */
				/* in graphics.txt, 2 corresponds to adam bolt's tiles */
				arg_graphics = 2; 
				if (*arg) arg_graphics = atoi(arg);
				break;

			case 'u': {
				if (!*arg) goto usage;

				my_strcpy(arg_name, arg, sizeof(arg_name));

				/* The difference here is because on setgid we have to be
				 * careful to only let the player have savefiles stored in
				 * the central save directory.  Sanitising input using
				 * player_safe_name() removes anything like that.
				 *
				 * But if the player is running with per-user saves, they
				 * can do whatever the hell they want.
				 */
#ifdef SETGID
				savefile_set_name(arg, true, false);
#else
				savefile_set_name(arg, false, false);
#endif /* SETGID */

				continue;
			}

			case 'f':
				arg_force_name = true;
				break;

			case 'm':
				if (!*arg) goto usage;
				mstr = arg;
				continue;
#ifdef SOUND
			case 's':
				if (!*arg) goto usage;
				soundstr = arg;
				continue;
#endif
			case 'd':
				change_path(arg);
				continue;

			case '-':
				argv[i] = argv[0];
				argc = argc - i;
				argv = argv + i;
				args = false;
				break;

			default:
			usage:
				puts("Usage: angband [options] [-- subopts]");
				puts("  -c             Select savefile with a menu; overrides -n");
				puts("  -n             Start a new character (WARNING: overwrites default savefile without -u)");
				puts("  -l             Lists all savefiles you can play");
				puts("  -w             Resurrect dead character (marks savefile)");
				puts("  -g             Request graphics mode");
				puts("  -u<who>        Use your <who> savefile");
				puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
				for (i = 0; i < (int)N_ELEMENTS(change_path_values); i++) {
#ifdef SETGID
					if (!change_path_values[i].setgid_ok) continue;
#endif
					printf("    %s (default is %s)\n", change_path_values[i].name, *change_path_values[i].path);
				}
				puts("                 Multiple -d options are allowed.");
#ifdef SOUND
				puts("  -s<mod>        Use sound module <sys>:");
				print_sound_help();
#endif
				puts("  -m<sys>        Use module <sys>, where <sys> can be:");

				/* Print the name and help for each available module */
				for (i = 0; i < (int)N_ELEMENTS(modules); i++)
					printf("     %s   %s\n",
					       modules[i].name, modules[i].help);

				/* Actually abort the process */
				quit(NULL);
		}
		if (*arg) goto usage;
	}

	/* Hack -- Forget standard args */
	if (args) {
		argc = 1;
		argv[1] = NULL;
	}

	/* Install "quit" hook */
	quit_aux = quit_hook;

	/* If we were told which mode to use, then use it */
	if (mstr)
		ANGBAND_SYS = mstr;
#if !defined(WINDOWS) && !defined(DJGPP)
	if (setlocale(LC_CTYPE, "")) {
		/* Require UTF-8 */
		if (!streq(nl_langinfo(CODESET), "UTF-8"))
			quit("Angband requires UTF-8 support");
	}
#endif

#ifdef UNIX

	/* Get the "user name" as default player name, unless set with -u switch */
	if (!arg_name[0]) {
		user_name(arg_name, sizeof(arg_name), player_uid);

		/* Sanitise name and set as savefile */
		savefile_set_name(arg_name, true, false);
	}

	/* Create any missing directories */
	create_needed_dirs();

#endif /* UNIX */

	/* Try the modules in the order specified by modules[] */
	for (i = 0; i < (int)N_ELEMENTS(modules); i++) {
		/* User requested a specific module? */
		if (!mstr || (streq(mstr, modules[i].name))) {
			ANGBAND_SYS = modules[i].name;
			if (0 == modules[i].init(argc, argv)) {
				done = true;
				break;
			}
		}
	}

	/* Make sure we have a display! */
	if (!done) quit("Unable to prepare any 'display module'!");

	/* Catch nasty signals */
	signals_init();

	/* Set up the command hook */
	cmd_get_hook = textui_get_cmd;

	/*
	 * Set action that needs to be done if restarting without exiting.
	 * Also need to do it now.
	 */
#ifdef SOUND
	saved_argc = argc;
	saved_argv = argv;
#endif
	reinit_hook = generic_reinit;
	generic_reinit();

	/* Set up the display handlers and things. */
	init_display();
	init_angband();
	textui_init();

	/* Wait for response */
	pause_line(Term);

	/* Play the game */
	play_game((select_game) ?
		GAME_SELECT : ((new_game) ? GAME_NEW : GAME_LOAD));

	/* Free resources */
	textui_cleanup();
	cleanup_angband();
#ifdef SOUND
	close_sound();
#endif

	/* Quit */
	quit(NULL);

	/* Exit */
	return (0);
}